

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFModifiedPage.cpp
# Opt level: O1

EStatusCode __thiscall PDFModifiedPage::WritePage(PDFModifiedPage *this)

{
  size_t sVar1;
  iteratorType iVar2;
  bool bVar3;
  EStatusCode EVar4;
  EStatusCode EVar5;
  int iVar6;
  EPDFObjectType EVar7;
  ObjectsContext *pOVar8;
  IndirectObjectsReferenceRegistry *pIVar9;
  PDFDocumentCopyingContext *this_00;
  PDFParser *pPVar10;
  ObjectIDType inObjectID;
  PDFDictionary *pPVar11;
  Trace *pTVar12;
  ObjectsContext *pOVar13;
  string *psVar14;
  ObjectIDTypeSet *pOVar15;
  PDFObject *pPVar16;
  DocumentContext *pDVar17;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *this_01;
  _Rb_tree_node_base *p_Var18;
  PDFIndirectObjectReference *inValue;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  PDFStream *pPVar20;
  IByteWriter *pIVar21;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar22;
  RefCountPtr<PDFIndirectObjectReference> *this_02;
  SingleValueContainerIterator<std::vector<PDFObject_*,_std::allocator<PDFObject_*>_>_> refs;
  PDFObjectCastPtr<PDFArray> anArray;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  formResourcesNames;
  PDFObjectCastPtr<PDFDictionary> resourceDict;
  PDFObjectCastPtr<PDFDictionary> pageDictionaryObject;
  PrimitiveObjectsWriter primitivesWriter;
  MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
  pageDictionaryObjectIt;
  PDFObjectCastPtr<PDFDictionary> inheritedResources;
  undefined1 local_218 [8];
  undefined8 uStack_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208 [2];
  string local_1e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  PDFStream *local_1a8;
  ObjectsContext *local_1a0;
  RefCountPtr<PDFDictionary> local_198;
  RefCountPtr<PDFDictionary> local_188;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178;
  pointer local_160;
  MapIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
  local_158;
  RefCountPtr<PDFDictionary> local_140;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this_02 = (RefCountPtr<PDFIndirectObjectReference> *)local_218;
  EVar4 = EndContentContext(this);
  EVar5 = eSuccess;
  if (EVar4 != eSuccess) {
    this_00 = (PDFDocumentCopyingContext *)0x0;
    EVar5 = EVar4;
    goto LAB_001d24d3;
  }
  if (this->mIsDirty != true) {
    this_00 = (PDFDocumentCopyingContext *)0x0;
    goto LAB_001d24d3;
  }
  pOVar8 = PDFWriter::GetObjectsContext(this->mWriter);
  pIVar9 = ObjectsContext::GetInDirectObjectsRegistry(pOVar8);
  local_160 = (pointer)IndirectObjectsReferenceRegistry::AllocateNewObjectID(pIVar9);
  this_00 = PDFWriter::CreatePDFCopyingContextForModifiedFile(this->mWriter);
  pPVar10 = PDFDocumentCopyingContext::GetSourceDocumentParser(this_00);
  inObjectID = PDFParser::GetPageObjectID(pPVar10,this->mPageIndex);
  pPVar10 = PDFDocumentCopyingContext::GetSourceDocumentParser(this_00);
  pPVar11 = PDFParser::ParsePage(pPVar10,this->mPageIndex);
  local_188.mValue = PDFObjectCast<PDFDictionary>(&pPVar11->super_PDFObject);
  local_188._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a97b0;
  if (local_188.mValue == (PDFDictionary *)0x0) {
    EVar5 = eSuccess;
    bVar3 = true;
  }
  else {
    PDFDictionary::GetIterator(&local_158,local_188.mValue);
    EVar5 = ObjectsContext::StartModifiedIndirectObject(pOVar8,inObjectID);
    if (EVar5 == eSuccess) {
      pOVar13 = PDFWriter::GetObjectsContext(this->mWriter);
      local_1a8 = (PDFStream *)ObjectsContext::StartDictionary(pOVar13);
      local_1a0 = pOVar8;
      if (local_158.
          super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
          .mCurrentPosition._M_node !=
          local_158.
          super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
          .mEndPosition._M_node) {
        do {
          iVar2._M_node =
               local_158.
               super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
               .mEndPosition._M_node;
          if (local_158.
              super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
              .mFirstMove == true) {
            local_158.
            super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
            .mFirstMove = false;
          }
          else {
            local_158.
            super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
            .mCurrentPosition._M_node =
                 (_Base_ptr)
                 std::_Rb_tree_increment
                           (local_158.
                            super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                            .mCurrentPosition._M_node);
            if (local_158.
                super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                .mCurrentPosition._M_node == iVar2._M_node) break;
          }
          psVar14 = PDFName::GetValue_abi_cxx11_
                              (*(PDFName **)
                                (local_158.
                                 super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                 .mCurrentPosition._M_node + 1));
          iVar6 = std::__cxx11::string::compare((char *)psVar14);
          if (iVar6 != 0) {
            psVar14 = PDFName::GetValue_abi_cxx11_
                                (*(PDFName **)
                                  (local_158.
                                   super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                   .mCurrentPosition._M_node + 1));
            iVar6 = std::__cxx11::string::compare((char *)psVar14);
            if (iVar6 != 0) {
              psVar14 = PDFName::GetValue_abi_cxx11_
                                  (*(PDFName **)
                                    (local_158.
                                     super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                     .mCurrentPosition._M_node + 1));
              iVar6 = std::__cxx11::string::compare((char *)psVar14);
              if (iVar6 != 0) {
                psVar14 = PDFName::GetValue_abi_cxx11_
                                    (*(PDFName **)
                                      (local_158.
                                       super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                       .mCurrentPosition._M_node + 1));
                DictionaryContext::WriteKey((DictionaryContext *)local_1a8,psVar14);
                PDFDocumentCopyingContext::CopyDirectObjectAsIs
                          (this_00,(PDFObject *)
                                   local_158.
                                   super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                                   .mCurrentPosition._M_node[1]._M_parent);
              }
            }
          }
        } while (local_158.
                 super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                 .mCurrentPosition._M_node !=
                 local_158.
                 super_ContainerIterator<std::map<PDFName_*,_PDFObject_*,_PDFNameLess,_std::allocator<std::pair<PDFName_*const,_PDFObject_*>_>_>_>
                 .mEndPosition._M_node);
      }
      pPVar11 = local_188.mValue;
      paVar22 = &local_110.field_2;
      local_110._M_dataplus._M_p = (pointer)paVar22;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"Annots","");
      bVar3 = PDFDictionary::Exists(pPVar11,&local_110);
      pOVar8 = local_1a0;
      if (bVar3) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != paVar22) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
LAB_001d1815:
        local_218 = (undefined1  [8])local_208;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"Annots","");
        DictionaryContext::WriteKey((DictionaryContext *)local_1a8,(string *)local_218);
        if (local_218 != (undefined1  [8])local_208) {
          operator_delete((void *)local_218,local_208[0]._M_allocated_capacity + 1);
        }
        ObjectsContext::StartArray(pOVar8);
        pPVar11 = local_188.mValue;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Annots","");
        bVar3 = PDFDictionary::Exists(pPVar11,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (bVar3) {
          pPVar10 = PDFDocumentCopyingContext::GetSourceDocumentParser(this_00);
          pPVar11 = local_188.mValue;
          local_218 = (undefined1  [8])local_208;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"Annots","");
          pPVar16 = PDFParser::QueryDictionaryObject(pPVar10,pPVar11,(string *)local_218);
          local_1e8._M_string_length = (size_type)PDFObjectCast<PDFArray>(pPVar16);
          local_1e8._M_dataplus._M_p = (pointer)&PTR__RefCountPtr_003a97e8;
          if (local_218 != (undefined1  [8])local_208) {
            operator_delete((void *)local_218,local_208[0]._M_allocated_capacity + 1);
          }
          PDFArray::GetIterator((PDFArray *)local_1e8._M_string_length);
          while ((undefined1  [8])local_208[0]._0_8_ != local_218) {
            if (uStack_210._0_1_ == true) {
              uStack_210 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)((ulong)uStack_210 & 0xffffffffffffff00);
            }
            else {
              local_208[0]._0_8_ = local_208[0]._M_allocated_capacity + 8;
              if ((undefined1  [8])local_208[0]._0_8_ == local_218) break;
            }
            PDFDocumentCopyingContext::CopyDirectObjectAsIs
                      (this_00,*(PDFObject **)local_208[0]._0_8_);
          }
          RefCountPtr<PDFArray>::~RefCountPtr((RefCountPtr<PDFArray> *)&local_1e8);
        }
        pDVar17 = PDFWriter::GetDocumentContext(this->mWriter);
        this_01 = &PDFHummus::DocumentContext::GetAnnotations(pDVar17)->_M_t;
        if ((this_01->_M_impl).super__Rb_tree_header._M_node_count != 0) {
          for (p_Var18 = (this_01->_M_impl).super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var18 != &(this_01->_M_impl).super__Rb_tree_header;
              p_Var18 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var18)) {
            ObjectsContext::WriteNewIndirectObjectReference
                      (pOVar8,*(ObjectIDType *)(p_Var18 + 1),eTokenSeparatorSpace);
          }
        }
        std::
        _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
        ::clear(this_01);
        ObjectsContext::EndArray(pOVar8,eTokenSeparatorEndLine);
      }
      else {
        pDVar17 = PDFWriter::GetDocumentContext(this->mWriter);
        pOVar15 = PDFHummus::DocumentContext::GetAnnotations(pDVar17);
        sVar1 = (pOVar15->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != paVar22) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        pOVar8 = local_1a0;
        if (sVar1 != 0) goto LAB_001d1815;
      }
      local_218 = (undefined1  [8])local_208;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"Contents","");
      DictionaryContext::WriteKey((DictionaryContext *)local_1a8,(string *)local_218);
      if (local_218 != (undefined1  [8])local_208) {
        operator_delete((void *)local_218,local_208[0]._M_allocated_capacity + 1);
      }
      pPVar11 = local_188.mValue;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Contents","");
      bVar3 = PDFDictionary::Exists(pPVar11,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (bVar3) {
        ObjectsContext::StartArray(pOVar8);
        if (this->mEnsureContentEncapsulation == true) {
          pIVar9 = ObjectsContext::GetInDirectObjectsRegistry(pOVar8);
          local_1a0 = (ObjectsContext *)
                      IndirectObjectsReferenceRegistry::AllocateNewObjectID(pIVar9);
          ObjectsContext::WriteNewIndirectObjectReference
                    (pOVar8,(ObjectIDType)local_1a0,eTokenSeparatorSpace);
        }
        else {
          local_1a0 = (ObjectsContext *)0x0;
        }
        pPVar10 = PDFDocumentCopyingContext::GetSourceDocumentParser(this_00);
        pPVar11 = local_188.mValue;
        local_218 = (undefined1  [8])local_208;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"Contents","");
        local_1e8._M_string_length =
             (size_type)PDFParser::QueryDictionaryObject(pPVar10,pPVar11,(string *)local_218);
        local_1e8._M_dataplus._M_p = (pointer)&PTR__RefCountPtr_003a9780;
        if (local_218 != (undefined1  [8])local_208) {
          operator_delete((void *)local_218,local_208[0]._M_allocated_capacity + 1);
        }
        EVar7 = PDFObject::GetType((PDFObject *)local_1e8._M_string_length);
        pPVar11 = local_188.mValue;
        if (EVar7 == ePDFObjectStream) {
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Contents","");
          pPVar16 = PDFDictionary::QueryDirectObject(pPVar11,&local_90);
          uStack_210 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)PDFObjectCast<PDFIndirectObjectReference>(pPVar16);
          local_218 = (undefined1  [8])&PTR__RefCountPtr_003a9a10;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          ObjectsContext::WriteIndirectObjectReference
                    (pOVar8,*(ObjectIDType *)(uStack_210->_M_local_buf + 0x48),
                     *(unsigned_long *)(uStack_210->_M_local_buf + 0x50),eTokenSeparatorSpace);
LAB_001d1cae:
          RefCountPtr<PDFIndirectObjectReference>::~RefCountPtr(this_02);
        }
        else {
          EVar7 = PDFObject::GetType((PDFObject *)local_1e8._M_string_length);
          if (EVar7 == ePDFObjectArray) {
            PDFArray::GetIterator((PDFArray *)local_1e8._M_string_length);
            local_1c8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_1c8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__RefCountPtr_003a9a10;
            while ((undefined1  [8])local_208[0]._0_8_ != local_218) {
              if (uStack_210._0_1_ == true) {
                uStack_210 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)((ulong)uStack_210 & 0xffffffffffffff00);
              }
              else {
                local_208[0]._0_8_ = local_208[0]._M_allocated_capacity + 8;
                if ((undefined1  [8])local_208[0]._0_8_ == local_218) break;
              }
              inValue = PDFObjectCast<PDFIndirectObjectReference>(*(PDFObject **)local_208[0]._0_8_)
              ;
              RefCountPtr<PDFIndirectObjectReference>::operator=
                        ((RefCountPtr<PDFIndirectObjectReference> *)&local_1c8,inValue);
              ObjectsContext::WriteIndirectObjectReference
                        (pOVar8,*(ObjectIDType *)
                                 ((long)local_1c8.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish + 0x48),
                         *(unsigned_long *)
                          ((long)local_1c8.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish + 0x50),
                         eTokenSeparatorSpace);
            }
            this_02 = (RefCountPtr<PDFIndirectObjectReference> *)&local_1c8;
            goto LAB_001d1cae;
          }
        }
        ObjectsContext::WriteNewIndirectObjectReference
                  (pOVar8,(ObjectIDType)local_160,eTokenSeparatorSpace);
        ObjectsContext::EndArray(pOVar8,eTokenSeparatorNone);
        ObjectsContext::EndLine(pOVar8);
        RefCountPtr<PDFObject>::~RefCountPtr((RefCountPtr<PDFObject> *)&local_1e8);
      }
      else {
        local_218 = (undefined1  [8])local_160;
        uStack_210 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
        ObjectsContext::WriteIndirectObjectReference
                  (pOVar8,(ObjectReference *)local_218,eTokenSeparatorSpace);
        local_1a0 = (ObjectsContext *)0x0;
      }
      local_1c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_218 = (undefined1  [8])local_208;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"Resources","");
      DictionaryContext::WriteKey((DictionaryContext *)local_1a8,(string *)local_218);
      if (local_218 != (undefined1  [8])local_208) {
        operator_delete((void *)local_218,local_208[0]._M_allocated_capacity + 1);
      }
      pPVar11 = local_188.mValue;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Resources","");
      bVar3 = PDFDictionary::Exists(pPVar11,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      pPVar11 = local_188.mValue;
      if (bVar3) {
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Resources","");
        pPVar16 = PDFDictionary::QueryDirectObject(pPVar11,&local_d0);
        local_178.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)PDFObjectCast<PDFIndirectObjectReference>(pPVar16);
        local_178.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__RefCountPtr_003a9a10;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        pPVar11 = local_188.mValue;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"Resources","");
          pPVar16 = PDFDictionary::QueryDirectObject(pPVar11,&local_f0);
          local_198.mValue = PDFObjectCast<PDFDictionary>(pPVar16);
          local_198._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a97b0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
          pPVar10 = PDFDocumentCopyingContext::GetSourceDocumentParser(this_00);
          WriteModifiedResourcesDict_abi_cxx11_
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_1e8,this,pPVar10,local_198.mValue,pOVar8,this_00);
          local_208[0]._0_8_ =
               local_1c8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          uStack_210 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_1c8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
          local_218 = (undefined1  [8])
                      local_1c8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          local_1c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1e8._M_dataplus._M_p;
          local_1c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_1e8._M_string_length;
          local_1c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)local_1e8.field_2._M_allocated_capacity;
          local_1e8._M_dataplus._M_p = (pointer)0x0;
          local_1e8._M_string_length = 0;
          local_1e8.field_2._M_allocated_capacity = 0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_218);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_1e8);
          RefCountPtr<PDFDictionary>::~RefCountPtr(&local_198);
          paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
LAB_001d211d:
          paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
        }
        else {
          paVar22 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      **)((long)local_178.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish + 0x48);
          pIVar9 = ObjectsContext::GetInDirectObjectsRegistry(pOVar8);
          IndirectObjectsReferenceRegistry::GetObjectWriteInformation
                    ((GetObjectWriteInformationResult *)local_218,pIVar9,(ObjectIDType)paVar22);
          if ((local_218[0] != (string)0x1) || (uStack_210._1_1_ != true)) {
            local_1e8._M_string_length = 0;
            local_1e8._M_dataplus._M_p = (pointer)paVar22;
            DictionaryContext::WriteObjectReferenceValue
                      ((DictionaryContext *)local_1a8,(ObjectReference *)&local_1e8);
            goto LAB_001d211d;
          }
          pIVar9 = ObjectsContext::GetInDirectObjectsRegistry(pOVar8);
          paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)IndirectObjectsReferenceRegistry::AllocateNewObjectID(pIVar9);
          local_1e8._M_string_length = 0;
          local_1e8._M_dataplus._M_p = (pointer)paVar19;
          DictionaryContext::WriteObjectReferenceValue
                    ((DictionaryContext *)local_1a8,(ObjectReference *)&local_1e8);
        }
        RefCountPtr<PDFIndirectObjectReference>::~RefCountPtr
                  ((RefCountPtr<PDFIndirectObjectReference> *)&local_178);
      }
      else {
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"Parent","");
        bVar3 = PDFDictionary::Exists(pPVar11,&local_130);
        if (bVar3) {
          pPVar10 = PDFDocumentCopyingContext::GetSourceDocumentParser(this_00);
          pPVar11 = local_188.mValue;
          local_218 = (undefined1  [8])local_208;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"Parent","");
          pPVar16 = PDFParser::QueryDictionaryObject(pPVar10,pPVar11,(string *)local_218);
        }
        else {
          pPVar16 = (PDFObject *)0x0;
        }
        local_198.mValue = PDFObjectCast<PDFDictionary>(pPVar16);
        local_198._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a97b0;
        if ((bVar3) && (local_218 != (undefined1  [8])local_208)) {
          operator_delete((void *)local_218,local_208[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != &local_130.field_2) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        if (local_198.mValue == (PDFDictionary *)0x0) {
          WriteNewResourcesDictionary_abi_cxx11_(&local_178,this,pOVar8);
          local_1e8.field_2._M_allocated_capacity =
               (size_type)
               local_1c8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_1e8._M_string_length =
               (size_type)
               local_1c8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_1e8._M_dataplus._M_p =
               (pointer)local_1c8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          local_1c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               local_178.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_1c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_178.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_1c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               local_178.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_178.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_178.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_178.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_1e8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_178);
        }
        else {
          pPVar10 = PDFDocumentCopyingContext::GetSourceDocumentParser(this_00);
          pPVar16 = findInheritedResources(this,pPVar10,local_198.mValue);
          local_140.mValue = PDFObjectCast<PDFDictionary>(pPVar16);
          local_140._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a97b0;
          if (local_140.mValue == (PDFDictionary *)0x0) {
            WriteNewResourcesDictionary_abi_cxx11_(&local_178,this,pOVar8);
          }
          else {
            pPVar10 = PDFDocumentCopyingContext::GetSourceDocumentParser(this_00);
            WriteModifiedResourcesDict_abi_cxx11_
                      (&local_178,this,pPVar10,local_140.mValue,pOVar8,this_00);
          }
          local_1e8.field_2._M_allocated_capacity =
               (size_type)
               local_1c8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_1e8._M_string_length =
               (size_type)
               local_1c8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_1e8._M_dataplus._M_p =
               (pointer)local_1c8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          local_1c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               local_178.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_1c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_178.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_1c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               local_178.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_178.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_178.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_178.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_1e8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_178);
          RefCountPtr<PDFDictionary>::~RefCountPtr(&local_140);
        }
        RefCountPtr<PDFDictionary>::~RefCountPtr(&local_198);
        paVar22 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
        paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0;
      }
      ObjectsContext::EndDictionary(pOVar8,(DictionaryContext *)local_1a8);
      ObjectsContext::EndIndirectObject(pOVar8);
      if (paVar22 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
LAB_001d2364:
        PrimitiveObjectsWriter::PrimitiveObjectsWriter
                  ((PrimitiveObjectsWriter *)&local_178,(IByteWriter *)0x0);
        pOVar13 = local_1a0;
        if (local_1a0 == (ObjectsContext *)0x0) {
LAB_001d246b:
          EVar5 = ObjectsContext::StartNewIndirectObject(pOVar8,(ObjectIDType)local_160);
          if (EVar5 == eSuccess) {
            pPVar20 = ObjectsContext::StartPDFStream(pOVar8,(DictionaryContext *)0x0,false);
            pIVar21 = PDFStream::GetWriteStream(pPVar20);
            PrimitiveObjectsWriter::SetStreamForWriting
                      ((PrimitiveObjectsWriter *)&local_178,pIVar21);
            local_1a8 = pPVar20;
            if (pOVar13 != (ObjectsContext *)0x0) {
              local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"Q","");
              PrimitiveObjectsWriter::WriteKeyword((PrimitiveObjectsWriter *)&local_178,&local_1e8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                operator_delete(local_1e8._M_dataplus._M_p,
                                local_1e8.field_2._M_allocated_capacity + 1);
              }
            }
            if (local_1c8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                local_1c8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              paVar22 = &local_1e8.field_2;
              paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1c8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              do {
                local_1e8._M_dataplus._M_p = (pointer)paVar22;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"q","");
                PrimitiveObjectsWriter::WriteKeyword
                          ((PrimitiveObjectsWriter *)&local_178,&local_1e8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1e8._M_dataplus._M_p != paVar22) {
                  operator_delete(local_1e8._M_dataplus._M_p,
                                  local_1e8.field_2._M_allocated_capacity + 1);
                }
                PrimitiveObjectsWriter::WriteInteger
                          ((PrimitiveObjectsWriter *)&local_178,1,eTokenSeparatorSpace);
                PrimitiveObjectsWriter::WriteInteger
                          ((PrimitiveObjectsWriter *)&local_178,0,eTokenSeparatorSpace);
                PrimitiveObjectsWriter::WriteInteger
                          ((PrimitiveObjectsWriter *)&local_178,0,eTokenSeparatorSpace);
                PrimitiveObjectsWriter::WriteInteger
                          ((PrimitiveObjectsWriter *)&local_178,1,eTokenSeparatorSpace);
                PrimitiveObjectsWriter::WriteInteger
                          ((PrimitiveObjectsWriter *)&local_178,0,eTokenSeparatorSpace);
                PrimitiveObjectsWriter::WriteInteger
                          ((PrimitiveObjectsWriter *)&local_178,0,eTokenSeparatorSpace);
                local_1e8._M_dataplus._M_p = (pointer)paVar22;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"cm","");
                PrimitiveObjectsWriter::WriteKeyword
                          ((PrimitiveObjectsWriter *)&local_178,&local_1e8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1e8._M_dataplus._M_p != paVar22) {
                  operator_delete(local_1e8._M_dataplus._M_p,
                                  local_1e8.field_2._M_allocated_capacity + 1);
                }
                PrimitiveObjectsWriter::WriteName
                          ((PrimitiveObjectsWriter *)&local_178,(string *)paVar19,
                           eTokenSeparatorSpace);
                local_1e8._M_dataplus._M_p = (pointer)paVar22;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"Do","");
                PrimitiveObjectsWriter::WriteKeyword
                          ((PrimitiveObjectsWriter *)&local_178,&local_1e8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1e8._M_dataplus._M_p != paVar22) {
                  operator_delete(local_1e8._M_dataplus._M_p,
                                  local_1e8.field_2._M_allocated_capacity + 1);
                }
                local_1e8._M_dataplus._M_p = (pointer)paVar22;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"Q","");
                PrimitiveObjectsWriter::WriteKeyword
                          ((PrimitiveObjectsWriter *)&local_178,&local_1e8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1e8._M_dataplus._M_p != paVar22) {
                  operator_delete(local_1e8._M_dataplus._M_p,
                                  local_1e8.field_2._M_allocated_capacity + 1);
                }
                paVar19 = paVar19 + 2;
              } while (paVar19 !=
                       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_1c8.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
            }
            pPVar20 = local_1a8;
            EVar5 = ObjectsContext::EndPDFStream(pOVar8,local_1a8);
            PDFStream::~PDFStream(pPVar20);
            operator_delete(pPVar20,0xf0);
          }
          else {
            pTVar12 = Trace::DefaultTrace();
            Trace::TraceToLog(pTVar12,
                              "PDFModifiedPage::WritePage, failed to start content object %ld",
                              local_160);
          }
        }
        else {
          EVar5 = ObjectsContext::StartNewIndirectObject(pOVar8,(ObjectIDType)local_1a0);
          if (EVar5 == eSuccess) {
            pPVar20 = ObjectsContext::StartPDFStream(pOVar8,(DictionaryContext *)0x0,false);
            pIVar21 = PDFStream::GetWriteStream(pPVar20);
            PrimitiveObjectsWriter::SetStreamForWriting
                      ((PrimitiveObjectsWriter *)&local_178,pIVar21);
            local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"q","");
            PrimitiveObjectsWriter::WriteKeyword((PrimitiveObjectsWriter *)&local_178,&local_1e8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
              operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1
                             );
            }
            EVar5 = ObjectsContext::EndPDFStream(pOVar8,pPVar20);
            pOVar13 = local_1a0;
            PDFStream::~PDFStream(pPVar20);
            operator_delete(pPVar20,0xf0);
            if (EVar5 == eSuccess) goto LAB_001d246b;
            pTVar12 = Trace::DefaultTrace();
            Trace::TraceToLog(pTVar12,
                              "PDFModifiedPage::WritePage, failed to end encapsulating stream %ld",
                              pOVar13);
          }
          else {
            pTVar12 = Trace::DefaultTrace();
            Trace::TraceToLog(pTVar12,
                              "PDFModifiedPage::WritePage, failed to start encapsulating object %ld"
                              ,pOVar13);
          }
        }
        PrimitiveObjectsWriter::~PrimitiveObjectsWriter((PrimitiveObjectsWriter *)&local_178);
      }
      else if (paVar19 ==
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0) {
        EVar5 = ObjectsContext::StartModifiedIndirectObject(pOVar8,(ObjectIDType)paVar22);
        if (EVar5 == eSuccess) goto LAB_001d22a2;
        pTVar12 = Trace::DefaultTrace();
        Trace::TraceToLog(pTVar12,
                          "PDFModifiedPage::WritePage, failed to start modified resources object %ld"
                          ,paVar22);
      }
      else {
        EVar5 = ObjectsContext::StartNewIndirectObject(pOVar8,(ObjectIDType)paVar19);
        if (EVar5 == eSuccess) {
LAB_001d22a2:
          pPVar10 = PDFDocumentCopyingContext::GetSourceDocumentParser(this_00);
          pPVar16 = PDFParser::ParseNewObject(pPVar10,(ObjectIDType)paVar22);
          local_198.mValue = PDFObjectCast<PDFDictionary>(pPVar16);
          local_198._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a97b0;
          pPVar10 = PDFDocumentCopyingContext::GetSourceDocumentParser(this_00);
          WriteModifiedResourcesDict_abi_cxx11_
                    (&local_178,this,pPVar10,local_198.mValue,pOVar8,this_00);
          local_1e8.field_2._M_allocated_capacity =
               (size_type)
               local_1c8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_1e8._M_string_length =
               (size_type)
               local_1c8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_1e8._M_dataplus._M_p =
               (pointer)local_1c8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          local_1c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               local_178.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_1c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_178.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_1c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               local_178.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_178.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_178.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_178.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_1e8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_178);
          ObjectsContext::EndIndirectObject(pOVar8);
          RefCountPtr<PDFDictionary>::~RefCountPtr(&local_198);
          goto LAB_001d2364;
        }
        pTVar12 = Trace::DefaultTrace();
        Trace::TraceToLog(pTVar12,
                          "PDFModifiedPage::WritePage, failed to start new resources object %ld",
                          paVar19);
      }
      bVar3 = false;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1c8);
    }
    else {
      pTVar12 = Trace::DefaultTrace();
      Trace::TraceToLog(pTVar12,
                        "PDFModifiedPage::WritePage, failed to start modified page object %ld",
                        inObjectID);
      bVar3 = false;
    }
  }
  RefCountPtr<PDFDictionary>::~RefCountPtr(&local_188);
  if (bVar3) {
    return eFailure;
  }
LAB_001d24d3:
  if (this_00 != (PDFDocumentCopyingContext *)0x0) {
    PDFDocumentCopyingContext::~PDFDocumentCopyingContext(this_00);
    operator_delete(this_00,0xd0);
  }
  return EVar5;
}

Assistant:

PDFHummus::EStatusCode PDFModifiedPage::WritePage()
{
	EStatusCode status = EndContentContext(); // just in case someone forgot to close the latest content context
	PDFDocumentCopyingContext* copyingContext = NULL;

	do {
		if (status != eSuccess || !mIsDirty) {
			break;
		}

		// allocate an object ID for the new contents stream (for placing the form)
		// we first create the modified page object, so that we can define a name for the new form xobject
		// that is unique
		ObjectsContext& objectContext = mWriter->GetObjectsContext();
		ObjectIDType newContentObjectID = objectContext.GetInDirectObjectsRegistry().AllocateNewObjectID();
		ObjectIDType newEncapsulatingObjectID = 0;


		// create a copying context, so we can copy the page dictionary, and modify its contents + resources dict
		copyingContext = mWriter->CreatePDFCopyingContextForModifiedFile();

		// get the page object
		ObjectIDType pageObjectID = copyingContext->GetSourceDocumentParser()->GetPageObjectID(mPageIndex);
		PDFObjectCastPtr<PDFDictionary> pageDictionaryObject = copyingContext->GetSourceDocumentParser()->ParsePage(mPageIndex);
		if (!pageDictionaryObject)
		    return eFailure;
		MapIterator<PDFNameToPDFObjectMap>  pageDictionaryObjectIt = pageDictionaryObject->GetIterator();

		// create modified page object
		status = objectContext.StartModifiedIndirectObject(pageObjectID);
		if(status != eSuccess) {
			TRACE_LOG1("PDFModifiedPage::WritePage, failed to start modified page object %ld", pageObjectID);
			break;
		}
		DictionaryContext* modifiedPageObject = mWriter->GetObjectsContext().StartDictionary();

		// copy all elements of the page to the new page object, but the "Contents", "Resources" and "Annots" elements
		while (pageDictionaryObjectIt.MoveNext())
		{
			if (pageDictionaryObjectIt.GetKey()->GetValue() != "Resources" &&
				pageDictionaryObjectIt.GetKey()->GetValue() != "Contents" &&
				pageDictionaryObjectIt.GetKey()->GetValue() != "Annots")
			{
				modifiedPageObject->WriteKey(pageDictionaryObjectIt.GetKey()->GetValue());
				copyingContext->CopyDirectObjectAsIs(pageDictionaryObjectIt.GetValue());
			}
		}

		// Write new annotations entry, joining existing annotations, and new ones (from links attaching or what not)
		if (pageDictionaryObject->Exists("Annots") || mWriter->GetDocumentContext().GetAnnotations().size() > 0)
		{
			modifiedPageObject->WriteKey("Annots");
			objectContext.StartArray();

			// write old annots, if any exist
			if(pageDictionaryObject->Exists("Annots")) {
				PDFObjectCastPtr<PDFArray> anArray(copyingContext->GetSourceDocumentParser()->QueryDictionaryObject(pageDictionaryObject.GetPtr(), "Annots"));
				SingleValueContainerIterator<PDFObjectVector> refs = anArray->GetIterator();
				while (refs.MoveNext())
					copyingContext->CopyDirectObjectAsIs(refs.GetItem());

			}

			// write new annots from links
			ObjectIDTypeSet& annotations = mWriter->GetDocumentContext().GetAnnotations();
			if (annotations.size() > 0)
			{
				ObjectIDTypeSet::iterator it = annotations.begin();
				for (; it != annotations.end(); ++it)
					objectContext.WriteNewIndirectObjectReference(*it);
			}
			annotations.clear();
			objectContext.EndArray(eTokenSeparatorEndLine);

		}

		// Write new contents entry, joining the existing contents with the new one. take care of various scenarios of the existing Contents
		modifiedPageObject->WriteKey("Contents");
		if (!pageDictionaryObject->Exists("Contents"))
		{	// no contents
			objectContext.WriteIndirectObjectReference(newContentObjectID);
		}
		else
		{
			objectContext.StartArray();
			if (mEnsureContentEncapsulation)
			{
				newEncapsulatingObjectID = objectContext.GetInDirectObjectsRegistry().AllocateNewObjectID();
				objectContext.WriteNewIndirectObjectReference(newEncapsulatingObjectID);
			}

			RefCountPtr<PDFObject> pageContent(copyingContext->GetSourceDocumentParser()->QueryDictionaryObject(pageDictionaryObject.GetPtr(), "Contents"));
			if (pageContent->GetType() == PDFObject::ePDFObjectStream)
			{
				// single content stream. must be a refrence which points to it
				PDFObjectCastPtr<PDFIndirectObjectReference> ref(pageDictionaryObject->QueryDirectObject("Contents"));
				objectContext.WriteIndirectObjectReference(ref->mObjectID, ref->mVersion);
			}
			else if (pageContent->GetType() == PDFObject::ePDFObjectArray)
			{
				PDFArray* anArray = (PDFArray*)pageContent.GetPtr();

				// multiple content streams
				SingleValueContainerIterator<PDFObjectVector> refs = anArray->GetIterator();
				PDFObjectCastPtr<PDFIndirectObjectReference> ref;
				while (refs.MoveNext())
				{
					ref = refs.GetItem();
					objectContext.WriteIndirectObjectReference(ref->mObjectID, ref->mVersion);
				}

			}
			else {
				// this basically means no content...or whatever. just ignore.
			}

			objectContext.WriteNewIndirectObjectReference(newContentObjectID);
			objectContext.EndArray();
			objectContext.EndLine();
		}

		// Write a new resource entry. copy all but the "XObject" entry, which needs to be modified. Just for kicks i'm keeping the original 
		// form (either direct dictionary, or indirect object)
		ObjectIDType resourcesIndirect = 0;
		ObjectIDType newResourcesIndirect = 0;
		vector<string> formResourcesNames;

		modifiedPageObject->WriteKey("Resources");
		if (!pageDictionaryObject->Exists("Resources"))
		{
			// check if there's inherited dict. if so - write directly as a modified version
			PDFObjectCastPtr<PDFDictionary> parentDict(
				pageDictionaryObject->Exists("Parent") ? 
					copyingContext->GetSourceDocumentParser()->QueryDictionaryObject(pageDictionaryObject.GetPtr(), "Parent"): 
					NULL);
			if(!parentDict) {
				formResourcesNames = WriteNewResourcesDictionary(objectContext);
			}
			else {
				PDFObjectCastPtr<PDFDictionary> inheritedResources = findInheritedResources(copyingContext->GetSourceDocumentParser(),parentDict.GetPtr());
				if(!inheritedResources) {
					formResourcesNames = WriteNewResourcesDictionary(objectContext);
				} else {
					formResourcesNames = WriteModifiedResourcesDict(copyingContext->GetSourceDocumentParser(), inheritedResources.GetPtr(), objectContext, copyingContext);
				}
			}
		}
		else
		{
			// resources may be direct, or indirect. if direct, write as is, adding the new form xobject, otherwise wait till page object ends and write then
			PDFObjectCastPtr<PDFIndirectObjectReference> resourceDictRef(pageDictionaryObject->QueryDirectObject("Resources"));
			if (!resourceDictRef)
			{
				PDFObjectCastPtr<PDFDictionary> resourceDict(pageDictionaryObject->QueryDirectObject("Resources"));
				formResourcesNames = WriteModifiedResourcesDict(copyingContext->GetSourceDocumentParser(), resourceDict.GetPtr(), objectContext, copyingContext);
			}
			else
			{
				resourcesIndirect = resourceDictRef->mObjectID;
				// later will write a modified version of the resources dictionary, with the new form.
				// only modify the resources dict object if wasn't already modified (can happen when sharing resources dict between multiple pages).
				// in the case where it was alrady modified, create a new resources dictionary that's a copy, and use it instead, to avoid overwriting
				// the previous modification
				GetObjectWriteInformationResult res = objectContext.GetInDirectObjectsRegistry().GetObjectWriteInformation(resourcesIndirect);
				if (res.first && res.second.mIsDirty)
				{
					newResourcesIndirect = objectContext.GetInDirectObjectsRegistry().AllocateNewObjectID();
					modifiedPageObject->WriteObjectReferenceValue(newResourcesIndirect);
				}
				else
					modifiedPageObject->WriteObjectReferenceValue(resourcesIndirect);
			}
		}

		objectContext.EndDictionary(modifiedPageObject);
		objectContext.EndIndirectObject();

		if (resourcesIndirect != 0)
		{
			if (newResourcesIndirect != 0) {
				status = objectContext.StartNewIndirectObject(newResourcesIndirect);
				if(status != eSuccess) {
					TRACE_LOG1("PDFModifiedPage::WritePage, failed to start new resources object %ld", newResourcesIndirect);
					break;
				}				
			} else {
				status = objectContext.StartModifiedIndirectObject(resourcesIndirect);
				if(status != eSuccess) {
					TRACE_LOG1("PDFModifiedPage::WritePage, failed to start modified resources object %ld", resourcesIndirect);
					break;
				}
			}


			PDFObjectCastPtr<PDFDictionary> resourceDict(copyingContext->GetSourceDocumentParser()->ParseNewObject(resourcesIndirect));
			formResourcesNames = WriteModifiedResourcesDict(copyingContext->GetSourceDocumentParser(), resourceDict.GetPtr(), objectContext, copyingContext);
			objectContext.EndIndirectObject();
		}

		// if required write encapsulation code, so that new stream is independent of graphic context of original
		PDFStream* newStream;
		PrimitiveObjectsWriter primitivesWriter;
		if (newEncapsulatingObjectID != 0)
		{
			status = objectContext.StartNewIndirectObject(newEncapsulatingObjectID);
			if(status != eSuccess) {
				TRACE_LOG1("PDFModifiedPage::WritePage, failed to start encapsulating object %ld", newEncapsulatingObjectID);
				break;
			}
			newStream = objectContext.StartPDFStream();
			primitivesWriter.SetStreamForWriting(newStream->GetWriteStream());
			primitivesWriter.WriteKeyword("q");
			status = objectContext.EndPDFStream(newStream);
			delete newStream;
			if(status != eSuccess) {
				TRACE_LOG1("PDFModifiedPage::WritePage, failed to end encapsulating stream %ld", newEncapsulatingObjectID);
				break;
			}
		}

		// last but not least, create the actual content stream object, placing the form
		status = objectContext.StartNewIndirectObject(newContentObjectID);
		if(status != eSuccess) {
			TRACE_LOG1("PDFModifiedPage::WritePage, failed to start content object %ld", newContentObjectID);
			break;
		}		
		newStream = objectContext.StartPDFStream();
		primitivesWriter.SetStreamForWriting(newStream->GetWriteStream());

		if (newEncapsulatingObjectID != 0) {
			primitivesWriter.WriteKeyword("Q");
		}

		vector<string>::iterator it = formResourcesNames.begin();
		for (; it != formResourcesNames.end(); ++it)
		{
			primitivesWriter.WriteKeyword("q");
			primitivesWriter.WriteInteger(1);
			primitivesWriter.WriteInteger(0);
			primitivesWriter.WriteInteger(0);
			primitivesWriter.WriteInteger(1);
			primitivesWriter.WriteInteger(0);
			primitivesWriter.WriteInteger(0);
			primitivesWriter.WriteKeyword("cm");
			primitivesWriter.WriteName(*it);
			primitivesWriter.WriteKeyword("Do");
			primitivesWriter.WriteKeyword("Q");
		}

		status = objectContext.EndPDFStream(newStream);

		delete newStream;
	} while (false);

	delete copyingContext;

	return status;
}